

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::visitTupleExtract(OptimizeInstructions *this,TupleExtract *curr)

{
  Type type;
  Index index;
  Type *pTVar1;
  Expression **ppEVar2;
  LocalSet *pLVar3;
  LocalGet *result;
  Expression *pEVar4;
  Builder local_38;
  Builder builder;
  
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id != 1) &&
     (pEVar4 = curr->tuple, pEVar4->_id == TupleMakeId)) {
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    pTVar1 = wasm::Type::operator[](&pEVar4->type,(ulong)curr->index);
    type.id = pTVar1->id;
    index = Builder::addVar((this->
                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                            ).
                            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .
                            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .currFunction,type);
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (pEVar4 + 1),(ulong)curr->index);
    pLVar3 = Builder::makeLocalTee(&local_38,index,*ppEVar2,type);
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (pEVar4 + 1),(ulong)curr->index);
    *ppEVar2 = (Expression *)pLVar3;
    result = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    result->index = index;
    (result->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = type.id;
    pEVar4 = getDroppedChildrenAndAppend(this,pEVar4,(Expression *)result);
    replaceCurrent(this,pEVar4);
  }
  return;
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }